

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

ByteVector * __thiscall
ImgfsFile::DirEntry::getdatablock
          (ByteVector *__return_storage_ptr__,DirEntry *this,ImgfsFile *imgfs)

{
  ImgfsFile *imgfs_00;
  ByteVectorWriter *this_00;
  shared_ptr<ReadWriter> local_38;
  undefined1 local_21;
  ImgfsFile *local_20;
  ImgfsFile *imgfs_local;
  DirEntry *this_local;
  ByteVector *filedata;
  
  local_21 = 0;
  local_20 = imgfs;
  imgfs_local = (ImgfsFile *)this;
  this_local = (DirEntry *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  imgfs_00 = local_20;
  this_00 = (ByteVectorWriter *)operator_new(0x30);
  ByteVectorWriter::ByteVectorWriter(this_00,__return_storage_ptr__);
  std::shared_ptr<ReadWriter>::shared_ptr<ByteVectorWriter,void>(&local_38,this_00);
  savedirent(this,imgfs_00,&local_38);
  std::shared_ptr<ReadWriter>::~shared_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteVector getdatablock(ImgfsFile& imgfs)
        {
            ByteVector filedata;
            savedirent(imgfs, ReadWriter_ptr(new ByteVectorWriter(filedata)));
            return filedata;
        }